

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O3

void initHashMap(Mesh *mesh,VectorXd *x,double epsilon)

{
  uint uVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined8 local_40;
  int local_38;
  
  std::
  _Hashtable<OpenMesh::VectorT<int,_2>,_std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>,_std::__detail::_Select1st,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_myHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::clear(&neighbors._M_h);
  lVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < lVar3) {
    iVar5 = 0;
    lVar4 = 0;
    do {
      uVar1 = *(uint *)(*(long *)&(mesh->super_Mesh).
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                  .super_PolyConnectivity.field_0xc8 + lVar4 * 2);
      if (((int)uVar1 < 0) ||
         (*(int *)((ulong)((uVar1 & 1) << 4) +
                  (ulong)(uVar1 >> 1) * 0x20 +
                  *(long *)&(mesh->super_Mesh).
                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                            .super_PolyConnectivity.field_0xe0) < 0)) {
        pdVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        local_40 = CONCAT44((int)(pdVar2[lVar4 + 1] / epsilon),(int)(pdVar2[lVar4] / epsilon));
        local_38 = iVar5;
        std::
        _Hashtable<OpenMesh::VectorT<int,2>,std::pair<OpenMesh::VectorT<int,2>const,int>,std::allocator<std::pair<OpenMesh::VectorT<int,2>const,int>>,std::__detail::_Select1st,std::equal_to<OpenMesh::VectorT<int,2>>,myHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
        ::_M_emplace<std::pair<OpenMesh::VectorT<int,2>,int>>
                  ((_Hashtable<OpenMesh::VectorT<int,2>,std::pair<OpenMesh::VectorT<int,2>const,int>,std::allocator<std::pair<OpenMesh::VectorT<int,2>const,int>>,std::__detail::_Select1st,std::equal_to<OpenMesh::VectorT<int,2>>,myHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                    *)&neighbors,0,&local_40);
        lVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        ;
      }
      lVar4 = lVar4 + 2;
      iVar5 = iVar5 + 1;
    } while (lVar4 < lVar3);
  }
  return;
}

Assistant:

void initHashMap(const Mesh& mesh, const Eigen::VectorXd& x, double epsilon) {
    neighbors.clear();
    for (int i = 0; i < x.size(); i += 2) {
        OpenMesh::VertexHandle handle(i / 2);
        if (mesh.is_boundary(handle)) {
            OpenMesh::Vec2i idx(x[i] / epsilon, x[i + 1] / epsilon);
            neighbors.insert(std::make_pair(idx, i / 2));
        }
    }
}